

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O2

void __thiscall leveldb::WriteBatch::~WriteBatch(WriteBatch *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    std::__cxx11::string::~string((string *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

WriteBatch::~WriteBatch() = default;